

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

int ot::commissioner::DtlsSession::DtlsTimer::GetDelay(void *aDtlsTimer)

{
  uint uVar1;
  long lVar2;
  DtlsTimer *timer;
  
  uVar1 = 0xffffffff;
  if ((*(char *)((long)aDtlsTimer + 0xb8) == '\0') &&
     (uVar1 = 2, *(char *)((long)aDtlsTimer + 0xa9) == '\x01')) {
    lVar2 = std::chrono::_V2::system_clock::now();
    uVar1 = (uint)(*(long *)((long)aDtlsTimer + 0xb0) <= lVar2);
  }
  return uVar1;
}

Assistant:

int DtlsSession::DtlsTimer::GetDelay(void *aDtlsTimer)
{
    int  rval;
    auto timer = reinterpret_cast<const DtlsTimer *>(aDtlsTimer);

    if (timer->mCancelled)
    {
        rval = -1;
    }
    else if (!timer->IsRunning())
    {
        rval = 2;
    }
    else if (timer->mIntermediate <= Clock::now())
    {
        rval = 1;
    }
    else
    {
        rval = 0;
    }

    return rval;
}